

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262.c
# Opt level: O0

int h262_seqparm_ext(bitstream *str,h262_seqparm *seqparm)

{
  int iVar1;
  uint local_30;
  uint local_2c;
  uint32_t vbvh;
  uint32_t brh;
  uint32_t vsh;
  uint32_t hsh;
  h262_seqparm *seqparm_local;
  bitstream *str_local;
  
  brh = seqparm->horizontal_size >> 0xc;
  vbvh = seqparm->vertical_size >> 0xc;
  local_2c = seqparm->bit_rate >> 0x12;
  local_30 = seqparm->vbv_buffer_size >> 10;
  _vsh = seqparm;
  seqparm_local = (h262_seqparm *)str;
  iVar1 = vs_u(str,&seqparm->profile_and_level_indication,8);
  if (iVar1 == 0) {
    iVar1 = vs_u((bitstream *)seqparm_local,&_vsh->progressive_sequence,1);
    if (iVar1 == 0) {
      iVar1 = vs_u((bitstream *)seqparm_local,&_vsh->chroma_format,2);
      if (iVar1 == 0) {
        iVar1 = vs_u((bitstream *)seqparm_local,&brh,2);
        if (iVar1 == 0) {
          iVar1 = vs_u((bitstream *)seqparm_local,&vbvh,2);
          if (iVar1 == 0) {
            iVar1 = vs_u((bitstream *)seqparm_local,&local_2c,0xc);
            if (iVar1 == 0) {
              iVar1 = vs_mark((bitstream *)seqparm_local,1,1);
              if (iVar1 == 0) {
                iVar1 = vs_u((bitstream *)seqparm_local,&local_30,8);
                if (iVar1 == 0) {
                  iVar1 = vs_u((bitstream *)seqparm_local,&_vsh->low_delay,1);
                  if (iVar1 == 0) {
                    iVar1 = vs_u((bitstream *)seqparm_local,&_vsh->frame_rate_extension_n,2);
                    if (iVar1 == 0) {
                      iVar1 = vs_u((bitstream *)seqparm_local,&_vsh->frame_rate_extension_d,5);
                      if (iVar1 == 0) {
                        if (seqparm_local->horizontal_size == 1) {
                          _vsh->is_ext = 1;
                          _vsh->horizontal_size = brh << 0xc | _vsh->horizontal_size;
                          _vsh->vertical_size = vbvh << 0xc | _vsh->vertical_size;
                          _vsh->bit_rate = local_2c << 0x12 | _vsh->bit_rate;
                          _vsh->vbv_buffer_size = local_30 << 10 | _vsh->vbv_buffer_size;
                        }
                        str_local._4_4_ = 0;
                      }
                      else {
                        str_local._4_4_ = 1;
                      }
                    }
                    else {
                      str_local._4_4_ = 1;
                    }
                  }
                  else {
                    str_local._4_4_ = 1;
                  }
                }
                else {
                  str_local._4_4_ = 1;
                }
              }
              else {
                str_local._4_4_ = 1;
              }
            }
            else {
              str_local._4_4_ = 1;
            }
          }
          else {
            str_local._4_4_ = 1;
          }
        }
        else {
          str_local._4_4_ = 1;
        }
      }
      else {
        str_local._4_4_ = 1;
      }
    }
    else {
      str_local._4_4_ = 1;
    }
  }
  else {
    str_local._4_4_ = 1;
  }
  return str_local._4_4_;
}

Assistant:

int h262_seqparm_ext(struct bitstream *str, struct h262_seqparm *seqparm) {
	uint32_t hsh = seqparm->horizontal_size >> 12;
	uint32_t vsh = seqparm->vertical_size >> 12;
	uint32_t brh = seqparm->bit_rate >> 18;
	uint32_t vbvh = seqparm->vbv_buffer_size >> 10;
	if (vs_u(str, &seqparm->profile_and_level_indication, 8)) return 1;
	if (vs_u(str, &seqparm->progressive_sequence, 1)) return 1;
	if (vs_u(str, &seqparm->chroma_format, 2)) return 1;
	if (vs_u(str, &hsh, 2)) return 1;
	if (vs_u(str, &vsh, 2)) return 1;
	if (vs_u(str, &brh, 12)) return 1;
	if (vs_mark(str, 1, 1)) return 1;
	if (vs_u(str, &vbvh, 8)) return 1;
	if (vs_u(str, &seqparm->low_delay, 1)) return 1;
	if (vs_u(str, &seqparm->frame_rate_extension_n, 2)) return 1;
	if (vs_u(str, &seqparm->frame_rate_extension_d, 5)) return 1;
	if (str->dir == VS_DECODE) {
		seqparm->is_ext = 1;
		seqparm->horizontal_size |= hsh << 12;
		seqparm->vertical_size |= vsh << 12;
		seqparm->bit_rate |= brh << 18;
		seqparm->vbv_buffer_size |= vbvh << 10;
	}
	return 0;
}